

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string *name,Symbol symbol)

{
  __node_base *p_Var1;
  size_type *psVar2;
  pointer __s1;
  size_t size;
  _Hash_node_base *p_Var3;
  __buckets_ptr pp_Var4;
  int iVar5;
  LogMessage *pLVar6;
  _Hash_node_base *p_Var7;
  __node_ptr p_Var8;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var9;
  ulong uVar10;
  size_type __n;
  ulong uVar11;
  _Hash_node_base _Var12;
  size_type len;
  undefined1 auVar13 [16];
  pointer __ptr_1;
  __buckets_alloc_type __alloc;
  LogFinisher local_99;
  undefined1 local_98 [24];
  LogMessage local_80;
  pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece> local_48;
  
  __s1 = (name->_M_dataplus)._M_p;
  size = name->_M_string_length;
  local_98._0_8_ = symbol.ptr_;
  if ((long)size < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
  }
  Symbol::parent_name_key(&local_48,(Symbol *)local_98);
  if (size == local_48.second.length_) {
    if (size == 0 || __s1 == local_48.second.ptr_) goto LAB_00344b5f;
    iVar5 = bcmp(__s1,local_48.second.ptr_,size);
    if (iVar5 == 0) goto LAB_00344b5f;
  }
  internal::LogMessage::LogMessage
            ((LogMessage *)(local_98 + 0x18),LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
             ,0x685);
  pLVar6 = internal::LogMessage::operator<<
                     ((LogMessage *)(local_98 + 0x18),
                      "CHECK failed: (name) == (symbol.parent_name_key().second): ");
  internal::LogFinisher::operator=(&local_99,pLVar6);
  internal::LogMessage::~LogMessage((LogMessage *)(local_98 + 0x18));
LAB_00344b5f:
  pLVar6 = (LogMessage *)local_98;
  Symbol::parent_name_key(&local_48,(Symbol *)pLVar6);
  if (local_48.first != parent) {
    internal::LogMessage::LogMessage
              ((LogMessage *)(local_98 + 0x18),LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x686);
    pLVar6 = internal::LogMessage::operator<<
                       ((LogMessage *)(local_98 + 0x18),
                        "CHECK failed: (parent) == (symbol.parent_name_key().first): ");
    internal::LogFinisher::operator=(&local_99,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)(local_98 + 0x18));
  }
  p_Var7 = (_Hash_node_base *)
           std::__detail::
           _Hash_code_base<google::protobuf::Symbol,_google::protobuf::Symbol,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
           ::_M_hash_code((_Hash_code_base<google::protobuf::Symbol,_google::protobuf::Symbol,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                           *)local_98._0_8_,(Symbol *)pLVar6);
  uVar10 = (ulong)p_Var7 % (this->symbols_by_parent_)._M_h._M_bucket_count;
  p_Var8 = std::
           _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_node((_Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)this,uVar10,(key_type *)local_98,(__hash_code)p_Var7);
  if (p_Var8 == (__node_ptr)0x0) {
    local_98._8_8_ = operator_new(0x18);
    ((_Hash_node_base *)local_98._8_8_)->_M_nxt = (_Hash_node_base *)0x0;
    ((_Hash_node_base *)(local_98._8_8_ + 8))->_M_nxt = (_Hash_node_base *)local_98._0_8_;
    local_98._16_8_ = (this->symbols_by_parent_)._M_h._M_rehash_policy._M_next_resize;
    auVar13 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->symbols_by_parent_)._M_h._M_rehash_policy,
                         (this->symbols_by_parent_)._M_h._M_bucket_count,
                         (this->symbols_by_parent_)._M_h._M_element_count);
    __n = auVar13._8_8_;
    if ((auVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __s = (this->symbols_by_parent_)._M_h._M_buckets;
    }
    else {
      if (__n == 1) {
        __s = &(this->symbols_by_parent_)._M_h._M_single_bucket;
        (this->symbols_by_parent_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        ((new_allocator<std::__detail::_Hash_node_base_*> *)(local_98 + 0x18),__n,
                         (void *)0x0);
        memset(__s,0,__n * 8);
      }
      _Var12._M_nxt = (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt;
      (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var12._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(this->symbols_by_parent_)._M_h._M_before_begin;
        uVar10 = 0;
        do {
          p_Var3 = (_Var12._M_nxt)->_M_nxt;
          uVar11 = (ulong)_Var12._M_nxt[2]._M_nxt % __n;
          if (__s[uVar11] == (_Hash_node_base *)0x0) {
            (_Var12._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var12._M_nxt;
            __s[uVar11] = p_Var1;
            if ((_Var12._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var9 = __s + uVar10;
              goto LAB_00344cc4;
            }
          }
          else {
            (_Var12._M_nxt)->_M_nxt = __s[uVar11]->_M_nxt;
            pp_Var9 = &__s[uVar11]->_M_nxt;
            uVar11 = uVar10;
LAB_00344cc4:
            *pp_Var9 = _Var12._M_nxt;
          }
          _Var12._M_nxt = p_Var3;
          uVar10 = uVar11;
        } while (p_Var3 != (_Hash_node_base *)0x0);
      }
      pp_Var4 = (this->symbols_by_parent_)._M_h._M_buckets;
      if (&(this->symbols_by_parent_)._M_h._M_single_bucket != pp_Var4) {
        operator_delete(pp_Var4);
      }
      (this->symbols_by_parent_)._M_h._M_bucket_count = __n;
      (this->symbols_by_parent_)._M_h._M_buckets = __s;
      uVar10 = (ulong)p_Var7 % __n;
    }
    ((_Hash_node_base *)(local_98._8_8_ + 0x10))->_M_nxt = p_Var7;
    if (__s[uVar10] == (_Hash_node_base *)0x0) {
      p_Var7 = (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt;
      *(_Hash_node_base **)local_98._8_8_ = p_Var7;
      (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_98._8_8_;
      if (p_Var7 != (_Hash_node_base *)0x0) {
        __s[(ulong)p_Var7[2]._M_nxt % (this->symbols_by_parent_)._M_h._M_bucket_count] =
             (__node_base_ptr)local_98._8_8_;
        __s = (this->symbols_by_parent_)._M_h._M_buckets;
      }
      __s[uVar10] = &(this->symbols_by_parent_)._M_h._M_before_begin;
    }
    else {
      *(_Hash_node_base **)local_98._8_8_ = __s[uVar10]->_M_nxt;
      __s[uVar10]->_M_nxt = (_Hash_node_base *)local_98._8_8_;
    }
    psVar2 = &(this->symbols_by_parent_)._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
  }
  return p_Var8 == (__node_ptr)0x0;
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(const void* parent,
                                               const std::string& name,
                                               Symbol symbol) {
  GOOGLE_DCHECK_EQ(name, symbol.parent_name_key().second);
  GOOGLE_DCHECK_EQ(parent, symbol.parent_name_key().first);
  return symbols_by_parent_.insert(symbol).second;
}